

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,size_type expected_max_items_in_table,TransparentHasher *hf,
                 TransparentHasher *eql,SelectKey *ext,SetKey *set,
                 Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *this_00;
  TransparentHasher *in_RCX;
  long in_RSI;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  SelectKey *in_R8;
  SetKey *in_R9;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *in_stack_00000008;
  hasher *in_stack_ffffffffffffff68;
  Settings *in_stack_ffffffffffffff70;
  size_type local_78;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_stack_ffffffffffffffb0;
  alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_> local_40;
  SetKey *local_30;
  SelectKey *local_28;
  TransparentHasher *local_20;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  Settings::Settings(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  KeyInfo::KeyInfo(&in_RDI->key_info,local_28,local_30,local_20);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  if (local_10 == 0) {
    local_78 = 0x20;
  }
  else {
    local_78 = sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>
               ::min_buckets(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0);
  }
  in_RDI->num_buckets = local_78;
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>::Alloc<int>
            ((Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffb0,in_stack_00000008);
  alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>::alloc_impl
            (&local_40,
             (Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffb0);
  ValInfo::ValInfo(&in_RDI->val_info,&local_40);
  alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>::~alloc_impl
            ((alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_> *
             )0xa277fb);
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffb0);
  in_RDI->table = (pointer)0x0;
  this_00 = (sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  reset_thresholds(this_00,(size_type)in_RDI);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }